

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::concat<char[3]>(path *this,char (*x) [3])

{
  path p;
  
  path<char[3],ghc::filesystem::path>(&p,x,auto_format);
  std::__cxx11::string::append((string *)this);
  postprocess_path_with_format(this,native_format);
  ~path(&p);
  return this;
}

Assistant:

inline path& path::concat(const Source& x)
{
    path p(x);
    _path += p._path;
    postprocess_path_with_format(native_format);
    return *this;
}